

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O2

void __thiscall Fl_Table::col_position(Fl_Table *this,int col)

{
  long lVar1;
  int iVar2;
  int col_00;
  double v;
  
  if ((this->_col_position != col) && (this->tiw < this->table_w)) {
    iVar2 = this->_cols + -1;
    if (col < this->_cols) {
      iVar2 = col;
    }
    col_00 = 0;
    if (-1 < col) {
      col_00 = iVar2;
    }
    lVar1 = col_scroll_position(this,col_00);
    v = (this->hscrollbar->super_Fl_Slider).super_Fl_Valuator.max;
    if ((double)lVar1 <= v) {
      v = (double)lVar1;
    }
    Fl_Valuator::value((Fl_Valuator *)this->hscrollbar,v);
    table_scrolled(this);
    Fl_Widget::redraw((Fl_Widget *)this);
    this->_col_position = col_00;
  }
  return;
}

Assistant:

void Fl_Table::col_position(int col) {
  if ( _col_position == col ) return;	// OPTIMIZATION: no change? avoid redraw
  if ( col < 0 ) col = 0;
  else if ( col >= cols() ) col = cols() - 1;
  if ( table_w <= tiw ) return;		// don't scroll if table smaller than window
  double newleft = col_scroll_position(col);
  if ( newleft > hscrollbar->maximum() ) {
    newleft = hscrollbar->maximum();
  }
  hscrollbar->Fl_Slider::value(newleft);
  table_scrolled();
  redraw();
  _col_position = col;	// HACK: override what table_scrolled() came up with
}